

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AST.cpp
# Opt level: O1

void __thiscall AST::toDot(AST *this,string *filename)

{
  ASTree *this_00;
  pointer pcVar1;
  string local_38;
  
  this_00 = this->ast;
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + filename->_M_string_length);
  ASTree::toDot(this_00,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void AST::toDot(std::string filename) {
    return ast->toDot(filename);
}